

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::MergeUpdateLoop<duckdb::uhugeint_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  SelectionVector *pSVar8;
  sel_t *psVar9;
  row_t rVar10;
  undefined8 uVar11;
  ulong uVar12;
  void *__dest_00;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined8 *puVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  uhugeint_t result_values [2048];
  uint local_a038 [2048];
  undefined8 local_8038 [4097];
  
  lVar20 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar3 = base_info->max;
  lVar2 = (ulong)uVar3 * 4;
  uVar4 = update_info->max;
  lVar26 = (ulong)uVar4 * 4;
  if (count == 0) {
    uVar13 = (ulong)update_info->N;
    lVar24 = 0;
    uVar25 = 0;
  }
  else {
    pdVar6 = base_data->data;
    psVar7 = sel->sel_vector;
    uVar13 = (ulong)update_info->N;
    uVar18 = (ulong)base_info->N;
    uVar21 = 0;
    uVar25 = 0;
    uVar12 = 0;
    lVar24 = 0;
    do {
      uVar14 = uVar12;
      if (psVar7 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar7[uVar12];
      }
      uVar14 = ids[uVar14] - lVar20;
      lVar23 = lVar24;
      if (uVar25 < uVar13) {
        lVar15 = 0;
        lVar19 = 0;
        do {
          uVar5 = *(uint *)((long)&update_info[1].segment + lVar19 * 4 + uVar25 * 4);
          if (uVar14 <= uVar5) {
            lVar23 = lVar24 + lVar19;
            if (uVar14 != uVar5) {
              uVar25 = uVar25 + lVar19;
              goto LAB_00622e0b;
            }
            puVar16 = (undefined8 *)
                      ((long)&update_info[1].segment + lVar15 + uVar25 * 0x10 + lVar26);
            uVar11 = puVar16[1];
            puVar1 = (undefined8 *)((long)local_8038 + lVar15 + lVar24 * 0x10);
            *puVar1 = *puVar16;
            puVar1[1] = uVar11;
            local_a038[lVar24 + lVar19] = uVar5;
            uVar25 = uVar25 + lVar19 + 1;
            goto LAB_00622e73;
          }
          puVar1 = (undefined8 *)((long)&update_info[1].segment + lVar15 + uVar25 * 0x10 + lVar26);
          uVar11 = puVar1[1];
          puVar16 = (undefined8 *)((long)local_8038 + lVar15 + lVar24 * 0x10);
          *puVar16 = *puVar1;
          puVar16[1] = uVar11;
          local_a038[lVar24 + lVar19] = uVar5;
          lVar19 = lVar19 + 1;
          lVar15 = lVar15 + 0x10;
        } while ((uVar25 - uVar13) + lVar19 != 0);
        lVar23 = lVar24 + lVar19;
        uVar25 = uVar13;
      }
LAB_00622e0b:
      uVar22 = uVar21;
      if (uVar21 < uVar18) {
        puVar16 = (undefined8 *)((long)&base_info[1].segment + uVar21 * 0x10 + lVar2);
        do {
          uVar17 = (ulong)*(uint *)((long)&__dest->segment + uVar21 * 4);
          if (uVar14 <= uVar17) {
            uVar22 = uVar21;
            if (uVar14 == uVar17) {
              uVar11 = puVar16[1];
              local_8038[lVar23 * 2] = *puVar16;
              local_8038[lVar23 * 2 + 1] = uVar11;
              goto LAB_00622e6b;
            }
            break;
          }
          uVar21 = uVar21 + 1;
          puVar16 = puVar16 + 2;
          uVar22 = uVar18;
        } while (uVar18 != uVar21);
      }
      uVar11 = *(undefined8 *)(pdVar6 + uVar14 * 0x10 + 8);
      local_8038[lVar23 * 2] = *(undefined8 *)(pdVar6 + uVar14 * 0x10);
      local_8038[lVar23 * 2 + 1] = uVar11;
      uVar21 = uVar22;
LAB_00622e6b:
      local_a038[lVar23] = (uint)uVar14;
LAB_00622e73:
      lVar24 = lVar23 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 != count);
  }
  pSVar8 = update->sel;
  pdVar6 = update->data;
  lVar23 = uVar13 - uVar25;
  if (uVar25 <= uVar13 && lVar23 != 0) {
    switchD_00b03519::default
              (local_a038 + lVar24,(void *)((long)&update_info[1].segment + uVar25 * 4),lVar23 * 4);
    switchD_00b03519::default
              (local_8038 + lVar24 * 2,
               (void *)((long)&update_info[1].segment + lVar26 + uVar25 * 0x10),lVar23 * 0x10);
    lVar24 = (uVar13 + lVar24) - uVar25;
  }
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar3 * 4);
  update_info->N = (sel_t)lVar24;
  puVar16 = local_8038;
  switchD_00b03519::default
            ((void *)((long)&update_info[1].segment + (ulong)uVar4 * 4),puVar16,lVar24 << 4);
  switchD_00b03519::default(update_info + 1,local_a038,lVar24 << 2);
  uVar25 = (ulong)base_info->N;
  if (count == 0 || uVar25 == 0) {
    lVar26 = 0;
    uVar21 = 0;
    uVar13 = 0;
  }
  else {
    psVar7 = sel->sel_vector;
    psVar9 = pSVar8->sel_vector;
    lVar26 = 0;
    uVar13 = 0;
    uVar21 = 0;
    do {
      uVar12 = uVar13;
      if (psVar7 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar7[uVar13];
      }
      uVar18 = ids[uVar12] - lVar20;
      uVar3 = *(uint *)((long)&__dest->segment + uVar21 * 4);
      if (uVar18 == uVar3) {
        if (psVar9 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar9[uVar12];
        }
        uVar11 = *(undefined8 *)(pdVar6 + uVar12 * 0x10 + 8);
        *puVar16 = *(undefined8 *)(pdVar6 + uVar12 * 0x10);
        puVar16[1] = uVar11;
        local_a038[lVar26] = (uint)uVar18;
        uVar13 = uVar13 + 1;
LAB_0062303f:
        uVar21 = uVar21 + 1;
      }
      else {
        if (uVar3 <= uVar18) {
          puVar1 = (undefined8 *)((long)__dest_00 + uVar21 * 0x10);
          uVar11 = puVar1[1];
          *puVar16 = *puVar1;
          puVar16[1] = uVar11;
          local_a038[lVar26] = uVar3;
          goto LAB_0062303f;
        }
        if (psVar9 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar9[uVar12];
        }
        uVar11 = *(undefined8 *)(pdVar6 + uVar12 * 0x10 + 8);
        *puVar16 = *(undefined8 *)(pdVar6 + uVar12 * 0x10);
        puVar16[1] = uVar11;
        local_a038[lVar26] = (uint)uVar18;
        uVar13 = uVar13 + 1;
      }
      lVar26 = lVar26 + 1;
    } while ((uVar13 < count) && (puVar16 = puVar16 + 2, uVar21 < uVar25));
  }
  if (uVar13 < count) {
    psVar7 = sel->sel_vector;
    psVar9 = pSVar8->sel_vector;
    puVar16 = local_8038 + lVar26 * 2;
    do {
      uVar12 = uVar13;
      if (psVar7 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar7[uVar13];
      }
      uVar18 = uVar12;
      if (psVar9 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar9[uVar12];
      }
      rVar10 = ids[uVar12];
      uVar11 = *(undefined8 *)(pdVar6 + uVar18 * 0x10 + 8);
      *puVar16 = *(undefined8 *)(pdVar6 + uVar18 * 0x10);
      puVar16[1] = uVar11;
      local_a038[lVar26] = (int)rVar10 - (int)lVar20;
      lVar26 = lVar26 + 1;
      uVar13 = uVar13 + 1;
      puVar16 = puVar16 + 2;
    } while (count != uVar13);
  }
  lVar20 = uVar25 - uVar21;
  if (uVar21 <= uVar25 && lVar20 != 0) {
    switchD_00b03519::default
              (local_a038 + lVar26,(void *)((long)&base_info[1].segment + uVar21 * 4),lVar20 * 4);
    switchD_00b03519::default
              (local_8038 + lVar26 * 2,(void *)((long)&base_info[1].segment + lVar2 + uVar21 * 0x10)
               ,lVar20 * 0x10);
    lVar26 = lVar26 + lVar20;
  }
  base_info->N = (sel_t)lVar26;
  switchD_00b03519::default(__dest_00,local_8038,lVar26 << 4);
  switchD_00b03519::default(__dest,local_a038,lVar26 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}